

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall slang::ast::ElabSystemTaskSymbol::issueDiagnostic(ElabSystemTaskSymbol *this)

{
  ElabSystemTaskSymbol *this_00;
  uint uVar1;
  Diagnostic *this_01;
  uint uVar2;
  Expression *in_R9;
  string_view message;
  allocator<char> local_51;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> msg;
  string local_38;
  
  this_00 = (ElabSystemTaskSymbol *)(this->super_Symbol).parentScope;
  getMessage(&msg,this);
  if (msg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged == true) {
    switch(this->taskKind) {
    case Fatal:
      uVar1 = 6;
      uVar2 = 0x3c0000;
      break;
    case Error:
      uVar1 = 6;
      uVar2 = 0x350000;
      break;
    case Warning:
      uVar1 = 6;
      uVar2 = 0x1000000;
      break;
    case Info:
      uVar1 = 6;
      uVar2 = 0xe40000;
      break;
    case StaticAssert:
      message._M_str = (char *)this->assertCondition;
      message._M_len =
           (size_t)msg.
                   super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                   ._M_payload._M_value._M_str;
      reportStaticAssert(this_00,(Scope *)(this->super_Symbol).location,
                         (SourceLocation)
                         msg.
                         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                         ._M_payload._M_value._M_len,message,in_R9);
      return;
    default:
      uVar2 = 0;
      uVar1 = 0;
    }
    this_01 = Scope::addDiag((Scope *)this_00,(DiagCode)(uVar2 | uVar1),
                             (this->super_Symbol).location);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_38,(basic_string_view<char,_std::char_traits<char>_> *)&msg,
               &local_51);
    Diagnostic::addStringAllowEmpty(this_01,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void ElabSystemTaskSymbol::issueDiagnostic() const {
    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    auto msg = getMessage();
    if (!msg)
        return;

    DiagCode code;
    switch (taskKind) {
        case ElabSystemTaskKind::Fatal:
            code = diag::FatalTask;
            break;
        case ElabSystemTaskKind::Error:
            code = diag::ErrorTask;
            break;
        case ElabSystemTaskKind::Warning:
            code = diag::WarningTask;
            break;
        case ElabSystemTaskKind::Info:
            code = diag::InfoTask;
            break;
        case ElabSystemTaskKind::StaticAssert:
            reportStaticAssert(*scope, location, *msg, assertCondition);
            return;
    }

    scope->addDiag(code, location).addStringAllowEmpty(std::string(*msg));
}